

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall
VertexClustering::pushNeighbors
          (VertexClustering *this,VCFace *f,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q)

{
  iterator *piVar1;
  VCFace *pVVar2;
  mapped_type *pmVar3;
  _Elt_pointer pVVar4;
  VCEdge *__args;
  VCEdge *__args_00;
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_> *this_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  VCEdge e2;
  VCEdge e1;
  VCEdge e3;
  VCEdge local_68;
  VCEdge local_58;
  VCEdge local_48;
  key_type local_38;
  
  __args = &local_68;
  __args_00 = &local_68;
  this_00 = &this->edgeMap;
  local_68.f1 = *(VCFace **)f;
  pmVar3 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,(key_type *)&local_68);
  local_58.f1 = pmVar3->f1;
  local_58.f2 = pmVar3->f2;
  local_48.f1 = (VCFace *)CONCAT44(f->v3,f->v1);
  pmVar3 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,(key_type *)&local_48);
  local_68.f1 = pmVar3->f1;
  local_68.f2 = pmVar3->f2;
  local_38.a = f->v2;
  local_38.b = f->v3;
  pmVar3 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,&local_38);
  local_48.f1 = pmVar3->f1;
  local_48.f2 = pmVar3->f2;
  pVVar2 = e->f1;
  if (((local_58.f1 == pVVar2) && (local_58.f2 == e->f2)) ||
     ((local_58.f2 == pVVar2 && (local_58.f1 == e->f2)))) {
    pVVar4 = (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pVVar4 != (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      uVar5 = local_68.f1._0_4_;
      uVar6 = local_68.f1._4_4_;
      uVar7 = local_68.f2._0_4_;
      uVar8 = local_68.f2._4_4_;
      goto LAB_00115e73;
    }
LAB_00115ea7:
    std::deque<VCEdge,std::allocator<VCEdge>>::_M_push_back_aux<VCEdge_const&>
              ((deque<VCEdge,std::allocator<VCEdge>> *)q,__args);
  }
  else {
    if (((local_68.f1 != pVVar2) || (local_68.f2 != e->f2)) &&
       ((local_68.f2 != pVVar2 || (local_68.f1 != e->f2)))) {
      pVVar4 = (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pVVar4 == (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<VCEdge,std::allocator<VCEdge>>::_M_push_back_aux<VCEdge_const&>
                  ((deque<VCEdge,std::allocator<VCEdge>> *)q,&local_58);
      }
      else {
        pVVar4->f1 = local_58.f1;
        pVVar4->f2 = local_58.f2;
        piVar1 = &(q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      pVVar4 = (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pVVar4 == (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) goto LAB_00115ed4;
      local_48.f1._0_4_ = local_68.f1._0_4_;
      local_48.f1._4_4_ = local_68.f1._4_4_;
      local_48.f2._0_4_ = local_68.f2._0_4_;
      local_48.f2._4_4_ = local_68.f2._4_4_;
      goto LAB_00115ec5;
    }
    pVVar4 = (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pVVar4 == (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      __args = &local_58;
      goto LAB_00115ea7;
    }
    uVar5 = local_58.f1._0_4_;
    uVar6 = local_58.f1._4_4_;
    uVar7 = local_58.f2._0_4_;
    uVar8 = local_58.f2._4_4_;
LAB_00115e73:
    *(undefined4 *)&pVVar4->f1 = uVar5;
    *(undefined4 *)((long)&pVVar4->f1 + 4) = uVar6;
    *(undefined4 *)&pVVar4->f2 = uVar7;
    *(undefined4 *)((long)&pVVar4->f2 + 4) = uVar8;
    piVar1 = &(q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pVVar4 = (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pVVar4 == (q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    __args_00 = &local_48;
LAB_00115ed4:
    std::deque<VCEdge,std::allocator<VCEdge>>::_M_push_back_aux<VCEdge_const&>
              ((deque<VCEdge,std::allocator<VCEdge>> *)q,__args_00);
    return;
  }
LAB_00115ec5:
  *(undefined4 *)&pVVar4->f1 = local_48.f1._0_4_;
  *(undefined4 *)((long)&pVVar4->f1 + 4) = local_48.f1._4_4_;
  *(undefined4 *)&pVVar4->f2 = local_48.f2._0_4_;
  *(undefined4 *)((long)&pVVar4->f2 + 4) = local_48.f2._4_4_;
  piVar1 = &(q->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Deque_impl_data
            ._M_finish;
  piVar1->_M_cur = piVar1->_M_cur + 1;
  return;
}

Assistant:

void VertexClustering::pushNeighbors(VCFace *f, VCEdge& e, queue<VCEdge>* q)
{
	VCEdge e1(edgeMap[VCPair(f->v1, f->v2)]);
	VCEdge e2(edgeMap[VCPair(f->v1, f->v3)]);
	VCEdge e3(edgeMap[VCPair(f->v2, f->v3)]);
	if (e1 == e) {
		q->push(e2);
		q->push(e3);
	}
	else if (e2 == e) {
		q->push(e1);
		q->push(e3);
	}
	else {
		q->push(e1);
		q->push(e2);
	}
}